

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O2

size_t __thiscall Diligent::StandardFile::GetSize(StandardFile *this)

{
  long __off;
  size_t sVar1;
  FILE *__stream;
  string msg;
  
  __stream = (FILE *)this->m_pFile;
  if (__stream == (FILE *)0x0) {
    FormatString<char[19]>(&msg,(char (*) [19])"File is not opened");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,0x59);
    std::__cxx11::string::~string((string *)&msg);
    __stream = (FILE *)this->m_pFile;
  }
  __off = ftell(__stream);
  fseek((FILE *)this->m_pFile,0,2);
  sVar1 = ftell((FILE *)this->m_pFile);
  fseek((FILE *)this->m_pFile,__off,0);
  return sVar1;
}

Assistant:

size_t StandardFile::GetSize()
{
    VERIFY(m_pFile, "File is not opened");
    auto OrigPos = ftell(m_pFile);
    fseek(m_pFile, 0, SEEK_END);
    auto FileSize = ftell(m_pFile);

    fseek(m_pFile, OrigPos, SEEK_SET);
    return FileSize;
}